

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::DepthDrawCase::init(DepthDrawCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_00;
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_01;
  pointer pcVar1;
  float *pfVar2;
  BBoxState BVar3;
  int iVar4;
  Context *pCVar5;
  TestLog *log;
  pointer pLVar6;
  int iVar7;
  int iVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  bool bVar16;
  int iVar17;
  ContextType ctxType;
  deUint32 dVar18;
  uint uVar19;
  undefined4 extraout_var;
  RenderTarget *pRVar20;
  ShaderProgram *this_02;
  ObjectWrapper *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  pointer pLVar21;
  NotSupportedError *pNVar22;
  long *plVar23;
  TestError *this_04;
  ulong uVar24;
  undefined8 *puVar25;
  ulong uVar26;
  pointer pLVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  long lVar29;
  pointer pLVar30;
  char *pcVar31;
  char *pcVar32;
  pointer pLVar33;
  ulong uVar34;
  BBoxState *pBVar35;
  void *__s;
  long lVar36;
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined4 uVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined4 uVar52;
  undefined1 auVar53 [16];
  Random rnd;
  ScopedLogSection section;
  ostringstream buf;
  ProgramSources sources;
  undefined1 local_368 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [2];
  undefined1 local_338 [32];
  undefined1 local_318 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_308;
  long local_2f0;
  undefined1 local_2e8 [32];
  undefined1 local_2c8 [8];
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b8 [6];
  ios_base local_258 [8];
  ios_base local_250 [264];
  string local_148;
  int local_128;
  undefined4 uStack_124;
  long local_118 [2];
  undefined1 local_108 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_78;
  _Vector_impl_data local_58;
  
  iVar17 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_2f0 = CONCAT44(extraout_var,iVar17);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar16 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar16) {
    bVar16 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_primitive_bounding_box");
    if (!bVar16) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2c8 = (undefined1  [8])local_2b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_2c8);
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_state == STATE_PER_PRIMITIVE) &&
       (bVar16 = glu::ContextInfo::isExtensionSupported
                           (((this->super_TestCase).m_context)->m_contextInfo,
                            "GL_EXT_tessellation_shader"), !bVar16)) {
      pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_2c8 = (undefined1  [8])local_2b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_2c8,"Test requires GL_EXT_tessellation_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_2c8);
      __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  pBVar35 = &this->m_state;
  pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (pRVar20->m_depthBits == 0) {
    pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_2c8 = (undefined1  [8])local_2b8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c8,"Test requires depth buffer","");
    tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_2c8);
    __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context);
  if ((pRVar20->m_width < 0x100) ||
     (pRVar20 = Context::getRenderTarget((this->super_TestCase).m_context),
     pRVar20->m_height < 0x100)) {
    pNVar22 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_148._M_dataplus._M_p._0_4_ = 0x100;
    de::toString<int>((string *)local_338,(int *)&local_148);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318,
                   "Test requires ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338);
    plVar23 = (long *)std::__cxx11::string::append(local_318);
    local_368._0_8_ = *plVar23;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar23 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._0_8_ == paVar28) {
      local_358[0]._0_8_ = paVar28->_M_allocated_capacity;
      local_358[0]._8_8_ = plVar23[3];
      local_368._0_8_ = local_358;
    }
    else {
      local_358[0]._0_8_ = paVar28->_M_allocated_capacity;
    }
    local_368._8_8_ = plVar23[1];
    *plVar23 = (long)paVar28;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    local_128 = 0x100;
    de::toString<int>((string *)local_2e8,&local_128);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_368,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e8);
    plVar23 = (long *)std::__cxx11::string::append(local_108);
    local_2c8 = (undefined1  [8])*plVar23;
    paVar28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar23 + 2);
    if (local_2c8 == (undefined1  [8])paVar28) {
      local_2b8[0]._0_8_ = paVar28->_M_allocated_capacity;
      local_2b8[0]._8_8_ = plVar23[3];
      local_2c8 = (undefined1  [8])local_2b8;
    }
    else {
      local_2b8[0]._0_8_ = paVar28->_M_allocated_capacity;
    }
    _Stack_2c0._M_current = (int *)plVar23[1];
    *plVar23 = (long)paVar28;
    plVar23[1] = 0;
    *(undefined1 *)(plVar23 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError(pNVar22,(string *)local_2c8);
    __cxa_throw(pNVar22,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  local_2c8 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&_Stack_2c0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,
             "Rendering multiple triangle grids with with different z coordinates.\n",0x45);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,"Topmost grid is green-yellow, other grids are blue-red.\n",0x38
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,"Expecting only the green-yellow grid to be visible.\n",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,"Setting primitive bounding box ",0x1f);
  bVar16 = this->m_bboxSize == BBOX_EQUAL;
  pcVar31 = "to cover";
  if (bVar16) {
    pcVar31 = "to exactly cover";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,pcVar31,(ulong)bVar16 * 8 + 8);
  pcVar31 = " each triangle";
  if (*pBVar35 == STATE_GLOBAL) {
    pcVar31 = " each grid";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,pcVar31,(ulong)(*pBVar35 != STATE_GLOBAL) * 4 + 10);
  bVar16 = this->m_bboxSize == BBOX_EQUAL;
  pcVar31 = " and include some padding.";
  if (bVar16) {
    pcVar31 = ".";
  }
  lVar29 = 0x1a;
  if (bVar16) {
    lVar29 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,pcVar31,lVar29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,"Set bounding box using ",0x17);
  pcVar31 = "gl_BoundingBoxEXT output";
  if (*pBVar35 == STATE_GLOBAL) {
    pcVar31 = "PRIMITIVE_BOUNDING_BOX_EXT state";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&_Stack_2c0,pcVar31,(ulong)(*pBVar35 == STATE_GLOBAL) * 8 + 0x18);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,"\n",1);
  bVar16 = this->m_depthType == DEPTH_USER_DEFINED;
  pcVar31 = glcts::fixed_sample_locations_values + 1;
  if (bVar16) {
    pcVar31 = "Fragment depth is set in the fragment shader";
  }
  lVar29 = 0x2c;
  if (!bVar16) {
    lVar29 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&_Stack_2c0,pcVar31,lVar29);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_2c8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&_Stack_2c0);
  std::ios_base::~ios_base(local_250);
  memset(local_108,0,0xac);
  local_58._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_58._M_finish._1_7_ = 0;
  stack0xffffffffffffffb8 = SUB169((undefined1  [16])0x0,7);
  pCVar5 = (this->super_TestCase).m_context;
  BVar3 = this->m_state;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,
             "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nin highp vec4 a_colorMix;\nout highp vec4 vtx_colorMix;\n"
             ,0x66);
  if ((BVar3 == STATE_PER_PRIMITIVE) || (this->m_depthType != DEPTH_USER_DEFINED)) {
    if (BVar3 == STATE_PER_PRIMITIVE) goto LAB_01647cdf;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"out highp float v_fragDepth;\n",0x1d);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,
             "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n",0x43);
LAB_01647cdf:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"\nvoid main()\n{\n",0xf);
  bVar16 = this->m_depthType == DEPTH_USER_DEFINED;
  pcVar31 = 
  "\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
  ;
  if (bVar16) {
    pcVar31 = 
    "\thighp float dummyZ = a_position.z;\n\thighp float writtenZ = a_position.w;\n\tgl_Position = vec4(a_position.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
    ;
  }
  lVar29 = 0x76;
  if (bVar16) {
    lVar29 = 0xb1;
  }
  pcVar32 = "\tgl_Position = a_position;\n";
  if (BVar3 != STATE_PER_PRIMITIVE) {
    pcVar32 = pcVar31;
  }
  lVar36 = 0x1b;
  if (BVar3 != STATE_PER_PRIMITIVE) {
    lVar36 = lVar29;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar32,lVar36);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"\tvtx_colorMix = a_colorMix;\n}\n",0x1e);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base(local_258);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_318,(_anonymous_namespace_ *)pCVar5,(Context *)local_338._0_8_,pcVar31)
  ;
  local_368._0_8_ = local_368._4_8_ << 0x20;
  local_368._8_8_ = local_358[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_368 + 8),local_318._0_8_,(char *)(local_318._8_8_ + local_318._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + (ulong)(uint)local_368._0_4_ * 0x18),(value_type *)(local_368 + 8));
  if ((char *)local_368._8_8_ != local_358[0]._M_local_buf + 8) {
    operator_delete((void *)local_368._8_8_,local_358[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
  }
  if ((Context *)local_338._0_8_ != (Context *)(local_338 + 0x10)) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  pCVar5 = (this->super_TestCase).m_context;
  BVar3 = this->m_state;
  pcVar32 = "vtx_colorMix";
  if (BVar3 == STATE_PER_PRIMITIVE) {
    pcVar32 = "tess_eval_colorMix";
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,"${GLSL_VERSION_DECL}\nin mediump vec4 ",0x25);
  lVar29 = 0xc;
  if (BVar3 == STATE_PER_PRIMITIVE) {
    lVar29 = 0x12;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar32,lVar29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,";\n",2);
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"in mediump float v_fragDepth;\n",0x1e);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_2c8,
             "layout(location = 0) out mediump vec4 o_color;\nuniform highp vec4 u_color1;\nuniform highp vec4 u_color2;\n\nvoid main()\n{\n\to_color = mix(u_color1, u_color2, "
             ,0x9b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar32,lVar29);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,");\n",3);
  if (this->m_depthType == DEPTH_USER_DEFINED) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"\tgl_FragDepth = v_fragDepth * 0.5 + 0.5;\n",0x29);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
  std::ios_base::~ios_base(local_258);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            ((string *)local_318,(_anonymous_namespace_ *)pCVar5,(Context *)local_338._0_8_,pcVar31)
  ;
  local_368._0_4_ = 1;
  local_368._8_8_ = local_358[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_368 + 8),local_318._0_8_,(char *)(local_318._8_8_ + local_318._0_8_));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_108 + (ulong)(uint)local_368._0_4_ * 0x18),(value_type *)(local_368 + 8));
  if ((char *)local_368._8_8_ != local_358[0]._M_local_buf + 8) {
    operator_delete((void *)local_368._8_8_,local_358[0]._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._0_8_ != &local_308) {
    operator_delete((void *)local_318._0_8_,local_308._M_allocated_capacity + 1);
  }
  if ((Context *)local_338._0_8_ != (Context *)(local_338 + 0x10)) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  if (*pBVar35 == STATE_PER_PRIMITIVE) {
    pCVar5 = (this->super_TestCase).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${PRIMITIVE_BOUNDING_BOX_REQUIRE}\nlayout(vertices=3) out;\n\nuniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nin highp vec4 vtx_colorMix[];\nout highp vec4 tess_ctrl_colorMix[];\n\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\ttess_ctrl_colorMix[gl_InvocationID] = vtx_colorMix[0];\n\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n\n\t// real Z stored in w component\n\thighp vec4 minBound = vec4(min(min(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n\thighp vec4 maxBound = vec4(max(max(vec3(gl_in[0].gl_Position.xy, gl_in[0].gl_Position.w * u_depthScale + u_depthBias),\n\t                                   vec3(gl_in[1].gl_Position.xy, gl_in[1].gl_Position.w * u_depthScale + u_depthBias)),\n\t                               vec3(gl_in[2].gl_Position.xy, gl_in[2].gl_Position.w * u_depthScale + u_depthBias)), 1.0);\n"
               ,0x4f7);
    bVar16 = this->m_bboxSize == BBOX_EQUAL;
    pcVar32 = 
    "\thighp float nedPadding = mod(gl_in[0].gl_Position.z, 0.3);\n\thighp float posPadding = mod(gl_in[1].gl_Position.z, 0.3);\n\t${PRIM_GL_BOUNDING_BOX}[0] = minBound - vec4(0.0, 0.0, nedPadding, 0.0);\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound + vec4(0.0, 0.0, posPadding, 0.0);\n"
    ;
    if (bVar16) {
      pcVar32 = 
      "\t${PRIM_GL_BOUNDING_BOX}[0] = minBound;\n\t${PRIM_GL_BOUNDING_BOX}[1] = maxBound;\n";
    }
    lVar29 = 0x10c;
    if (bVar16) {
      lVar29 = 0x50;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar32,lVar29);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,"}\n",2);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base(local_258);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              ((string *)local_338,(_anonymous_namespace_ *)pCVar5,(Context *)local_2e8._0_8_,
               pcVar31);
    local_368._0_4_ = 3;
    local_368._8_8_ = local_358[0]._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_368 + 8),local_338._0_8_,
               (pointer)(local_338._0_8_ + local_338._8_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + (ulong)(uint)local_368._0_4_ * 0x18),(value_type *)(local_368 + 8));
    pCVar5 = (this->super_TestCase).m_context;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,
               "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\n\nin highp vec4 tess_ctrl_colorMix[];\nout highp vec4 tess_eval_colorMix;\n"
               ,0xa9);
    if (this->m_depthType == DEPTH_USER_DEFINED) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_2c8,"out highp float v_fragDepth;\n",0x1d);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,
               "uniform highp float u_depthBias;\nuniform highp float u_depthScale;\n\nprecise gl_Position;\n\nvoid main()\n{\n\thighp vec4 tessellatedPos = gl_TessCoord.x * gl_in[0].gl_Position + gl_TessCoord.y * gl_in[1].gl_Position + gl_TessCoord.z * gl_in[2].gl_Position;\n"
               ,0xfc);
    bVar16 = this->m_depthType == DEPTH_USER_DEFINED;
    pcVar32 = 
    "\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, writtenZ * u_depthScale + u_depthBias, 1.0);\n"
    ;
    if (bVar16) {
      pcVar32 = 
      "\thighp float dummyZ = tessellatedPos.z;\n\thighp float writtenZ = tessellatedPos.w;\n\tgl_Position = vec4(tessellatedPos.xy, dummyZ, 1.0);\n\tv_fragDepth = writtenZ * u_depthScale + u_depthBias;\n"
      ;
    }
    lVar29 = 0x7e;
    if (bVar16) {
      lVar29 = 0xbd;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_2c8,pcVar32,lVar29);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_2c8,"\ttess_eval_colorMix = tess_ctrl_colorMix[0];\n}\n",0x2f);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2c8);
    std::ios_base::~ios_base(local_258);
    Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
              (&local_148,(_anonymous_namespace_ *)pCVar5,(Context *)CONCAT44(uStack_124,local_128),
               pcVar31);
    local_318._0_4_ = 4;
    local_318._8_8_ = local_308._M_local_buf + 8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_318 + 8),
               CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_),
               local_148._M_string_length +
               CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + (local_318._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_318 + 8)
               );
    if ((char *)local_318._8_8_ != local_308._M_local_buf + 8) {
      operator_delete((void *)local_318._8_8_,local_308._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_) !=
        &local_148.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_148._M_dataplus._M_p._4_4_,local_148._M_dataplus._M_p._0_4_),
                      local_148.field_2._M_allocated_capacity + 1);
    }
    if ((long *)CONCAT44(uStack_124,local_128) != local_118) {
      operator_delete((long *)CONCAT44(uStack_124,local_128),local_118[0] + 1);
    }
    if ((char *)local_368._8_8_ != local_358[0]._M_local_buf + 8) {
      operator_delete((void *)local_368._8_8_,local_358[0]._8_8_ + 1);
    }
    if ((Context *)local_338._0_8_ != (Context *)(local_338 + 0x10)) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
    if ((Context *)local_2e8._0_8_ != (Context *)(local_2e8 + 0x10)) {
      operator_delete((void *)local_2e8._0_8_,local_2e8._16_8_ + 1);
    }
  }
  this_02 = (ShaderProgram *)operator_new(0xd0);
  glu::ShaderProgram::ShaderProgram
            (this_02,((this->super_TestCase).m_context)->m_renderCtx,(ProgramSources *)local_108);
  local_2c8 = (undefined1  [8])0x0;
  this_00 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      this_02) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_00->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = this_02;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            ((UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *)local_2c8);
  dVar18 = (**(code **)(local_2f0 + 0x800))();
  glu::checkError(dVar18,"build program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0xeca);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"ShaderProgram","");
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_368,"Shader program","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)local_318,log,(string *)local_2c8,(string *)local_368);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_,local_358[0]._M_allocated_capacity + 1);
  }
  if (local_2c8 != (undefined1  [8])local_2b8) {
    operator_delete((void *)local_2c8,local_2b8[0]._M_allocated_capacity + 1);
  }
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).
                  super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                  m_data.ptr);
  tcu::TestLog::endSection((TestLog *)local_318._0_8_);
  if ((((this_00->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
        m_data.ptr)->m_program).m_info.linkOk != false) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_58);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_78);
    lVar29 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_108 + lVar29));
      lVar29 = lVar29 + -0x18;
    } while (lVar29 != -0x18);
    local_108._0_16_ = (undefined1  [16])0x0;
    local_108._16_8_ = (pointer)0x0;
    local_368._0_4_ = 0;
    local_368._4_4_ = 0;
    local_368._8_4_ = 0;
    local_368._12_4_ = 0;
    local_318._0_8_ = (pointer)0x3f8000003f800000;
    local_318._8_8_ = 0x3f8000003f800000;
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_2c8,
               (long)(this->m_gridSize * this->m_gridSize),(allocator_type *)local_338);
    deRandom_init((deRandom *)local_338,0xab54321);
    auVar39 = _DAT_019ec5b0;
    uVar19 = (uint)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2);
    if (0 < (int)uVar19) {
      lVar29 = (ulong)(uVar19 & 0x7fffffff) - 1;
      auVar38._8_4_ = (int)lVar29;
      auVar38._0_8_ = lVar29;
      auVar38._12_4_ = (int)((ulong)lVar29 >> 0x20);
      uVar24 = 0;
      auVar38 = auVar38 ^ _DAT_019ec5b0;
      auVar48 = _DAT_019f34d0;
      do {
        auVar53 = auVar48 ^ auVar39;
        if ((bool)(~(auVar53._4_4_ == auVar38._4_4_ && auVar38._0_4_ < auVar53._0_4_ ||
                    auVar38._4_4_ < auVar53._4_4_) & 1)) {
          *(int *)((long)local_2c8 + uVar24 * 4) = (int)uVar24;
        }
        if ((auVar53._12_4_ != auVar38._12_4_ || auVar53._8_4_ <= auVar38._8_4_) &&
            auVar53._12_4_ <= auVar38._12_4_) {
          *(int *)((long)local_2c8 + (uVar24 + 1) * 4) = (int)uVar24 + 1;
        }
        uVar24 = uVar24 + 2;
        lVar29 = auVar48._8_8_;
        auVar48._0_8_ = auVar48._0_8_ + 2;
        auVar48._8_8_ = lVar29 + 2;
      } while ((uVar19 + 1 & 0xfffffffe) != uVar24);
    }
    de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((Random *)local_338,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_2c8,
               _Stack_2c0);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_108,
               (long)(this->m_gridSize * this->m_gridSize * 0xc));
    if (0 < (int)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2)) {
      iVar17 = 0;
      lVar29 = 0;
      do {
        iVar4 = this->m_gridSize;
        iVar7 = *(int *)((long)local_2c8 + lVar29 * 4) / iVar4;
        iVar8 = *(int *)((long)local_2c8 + lVar29 * 4) % iVar4;
        puVar25 = (undefined8 *)local_318;
        if ((iVar7 + iVar8 & 1U) == 0) {
          puVar25 = (undefined8 *)local_368;
        }
        auVar40._0_4_ = (float)iVar4;
        iVar4 = (int)lVar29;
        auVar39._4_4_ = (float)iVar7;
        uVar24 = CONCAT44(auVar39._4_4_,(float)iVar8);
        auVar40._4_4_ = auVar40._0_4_;
        auVar40._8_4_ = auVar40._0_4_;
        auVar40._12_4_ = auVar40._0_4_;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = uVar24;
        auVar48 = divps(auVar47,auVar40);
        (&((pointer)local_108._0_8_)->_M_dataplus)[(long)(iVar4 * 0xc) * 2]._M_p =
             (pointer)CONCAT44(auVar48._4_4_ + auVar48._4_4_ + -1.0,
                               auVar48._0_4_ + auVar48._0_4_ + -1.0);
        (&((pointer)local_108._0_8_)->_M_dataplus + (long)(iVar4 * 0xc) * 2)[1] = (pointer)0x0;
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 1) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 1) * 0x10) + 8) = uVar9;
        auVar49._0_4_ = (float)this->m_gridSize;
        auVar41._0_8_ = CONCAT44((float)(iVar7 + 1),(float)(iVar8 + 1));
        auVar41._8_4_ = 0x3f800000;
        auVar41._12_4_ = 0x3f800000;
        auVar49._4_4_ = auVar49._0_4_;
        auVar49._8_4_ = auVar49._0_4_;
        auVar49._12_4_ = auVar49._0_4_;
        auVar42._8_4_ = 0x3f800000;
        auVar42._0_8_ = auVar41._0_8_;
        auVar42._12_4_ = 0x3f800000;
        auVar48 = divps(auVar42,auVar49);
        pcVar1 = (pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 2) * 0x10);
        *(ulong *)pcVar1 =
             CONCAT44(auVar48._4_4_ + auVar48._4_4_ + -1.0,auVar48._0_4_ + auVar48._0_4_ + -1.0);
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 3) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 3) * 0x10) + 8) = uVar9;
        auVar43._0_4_ = (float)this->m_gridSize;
        auVar50._4_4_ = (float)(iVar7 + 1);
        auVar50._0_4_ = (float)iVar8;
        auVar50._8_8_ = 0;
        auVar43._4_4_ = auVar43._0_4_;
        auVar43._8_4_ = auVar43._0_4_;
        auVar43._12_4_ = auVar43._0_4_;
        auVar48 = divps(auVar50,auVar43);
        pcVar1 = (pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 4) * 0x10);
        *(ulong *)pcVar1 =
             CONCAT44(auVar48._4_4_ + auVar48._4_4_ + -1.0,auVar48._0_4_ + auVar48._0_4_ + -1.0);
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 5) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 5) * 0x10) + 8) = uVar9;
        auVar44._0_4_ = (float)this->m_gridSize;
        auVar44._4_4_ = auVar44._0_4_;
        auVar44._8_4_ = auVar44._0_4_;
        auVar44._12_4_ = auVar44._0_4_;
        auVar51._8_8_ = 0;
        auVar51._0_8_ = uVar24;
        auVar48 = divps(auVar51,auVar44);
        pcVar1 = (pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 6) * 0x10);
        *(ulong *)pcVar1 =
             CONCAT44(auVar48._4_4_ + auVar48._4_4_ + -1.0,auVar48._0_4_ + auVar48._0_4_ + -1.0);
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 7) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 7) * 0x10) + 8) = uVar9;
        auVar45._0_4_ = (float)this->m_gridSize;
        auVar39._0_4_ = (float)(iVar8 + 1);
        auVar39._8_4_ = 0x3f800000;
        auVar39._12_4_ = 0x3f800000;
        auVar45._4_4_ = auVar45._0_4_;
        auVar45._8_4_ = auVar45._0_4_;
        auVar45._12_4_ = auVar45._0_4_;
        auVar39 = divps(auVar39,auVar45);
        pcVar1 = (pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 8) * 0x10);
        *(ulong *)pcVar1 =
             CONCAT44(auVar39._4_4_ + auVar39._4_4_ + -1.0,auVar39._0_4_ + auVar39._0_4_ + -1.0);
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 9) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 9) * 0x10) + 8) = uVar9;
        auVar53._0_4_ = (float)this->m_gridSize;
        auVar53._4_4_ = auVar53._0_4_;
        auVar53._8_4_ = auVar53._0_4_;
        auVar53._12_4_ = auVar53._0_4_;
        auVar39 = divps(auVar41,auVar53);
        pcVar1 = (pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 10) * 0x10);
        *(ulong *)pcVar1 =
             CONCAT44(auVar39._4_4_ + auVar39._4_4_ + -1.0,auVar39._0_4_ + auVar39._0_4_ + -1.0);
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        uVar9 = puVar25[1];
        *(undefined8 *)(local_108._0_8_ + (long)(iVar4 * 0xc + 0xb) * 0x10) = *puVar25;
        *(undefined8 *)((pointer)(local_108._0_8_ + (long)(iVar4 * 0xc + 0xb) * 0x10) + 8) = uVar9;
        lVar36 = 0;
        do {
          fVar37 = deRandom_getFloat((deRandom *)local_338);
          *(float *)(local_108._0_8_ + (long)(iVar17 + (int)lVar36) * 0x10 + 8) = fVar37 + 0.0;
          lVar36 = lVar36 + 2;
        } while (lVar36 != 0xc);
        lVar36 = 0;
        do {
          fVar37 = deRandom_getFloat((deRandom *)local_338);
          *(float *)(local_108._0_8_ + (long)(iVar17 + (int)lVar36) * 0x10 + 0xc) = fVar37 + 0.0;
          lVar36 = lVar36 + 2;
        } while (lVar36 != 0xc);
        lVar29 = lVar29 + 1;
        iVar17 = iVar17 + 0xc;
      } while (lVar29 < (int)((ulong)((long)_Stack_2c0._M_current - (long)local_2c8) >> 2));
    }
    if (local_2c8 != (undefined1  [8])0x0) {
      operator_delete((void *)local_2c8,local_2b8[0]._M_allocated_capacity - (long)local_2c8);
    }
    this_03 = (ObjectWrapper *)operator_new(0x18);
    iVar17 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    traits = glu::objectTraits(OBJECTTYPE_BUFFER);
    glu::ObjectWrapper::ObjectWrapper(this_03,(Functions *)CONCAT44(extraout_var_00,iVar17),traits);
    local_2c8 = (undefined1  [8])0x0;
    this_01 = &this->m_vbo;
    if (&((this->m_vbo).
          super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
          .m_data.ptr)->super_ObjectWrapper != this_03) {
      de::details::
      UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ::reset(&this_01->
               super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             );
      (this_01->
      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
      ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_03;
    }
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
             *)local_2c8);
    (**(code **)(local_2f0 + 0x40))
              (0x8892,(((this_01->
                        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                        ).m_data.ptr)->super_ObjectWrapper).m_object);
    (**(code **)(local_2f0 + 0x150))
              (0x8892,(long)(local_108._8_4_ - local_108._0_4_) & 0xfffffffffffffff0,local_108._0_8_
               ,0x88e4);
    dVar18 = (**(code **)(local_2f0 + 0x800))();
    glu::checkError(dVar18,"buf upload",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                    ,0xedd);
    if ((pointer)local_108._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ - local_108._0_8_);
    }
    deRandom_init((deRandom *)local_368,0x12345);
    uVar26 = (ulong)this->m_numLayers;
    pLVar6 = (this->m_layers).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar33 = (this->m_layers).
              super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    lVar36 = (long)pLVar33 - (long)pLVar6;
    lVar29 = lVar36 >> 3;
    uVar24 = lVar29 * -0x3333333333333333;
    uVar34 = uVar26 + lVar29 * 0x3333333333333333;
    if (uVar26 < uVar24 || uVar34 == 0) {
      if ((uVar26 < uVar24) && (pLVar6 = pLVar6 + uVar26, pLVar33 != pLVar6)) {
        (this->m_layers).
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
        ._M_impl.super__Vector_impl_data._M_finish = pLVar6;
        pLVar33 = pLVar6;
      }
    }
    else if ((ulong)(((long)(this->m_layers).
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pLVar33 >> 3)
                    * -0x3333333333333333) < uVar34) {
      if (lVar29 * 0x3333333333333333 + 0x333333333333333U < uVar34) {
        std::__throw_length_error("vector::_M_default_append");
      }
      uVar26 = uVar34;
      if (uVar34 <= uVar24 && uVar24 - uVar34 != 0) {
        uVar26 = uVar24;
      }
      uVar26 = uVar26 + uVar24;
      if (0x333333333333332 < uVar26) {
        uVar26 = 0x333333333333333;
      }
      pLVar21 = (pointer)operator_new(uVar26 * 0x28);
      __s = (void *)(lVar36 + (long)pLVar21);
      memset(__s,0,uVar34 * 0x28);
      pLVar6 = (this->m_layers).
               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pLVar33 = (this->m_layers).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pLVar27 = pLVar21;
      for (pLVar30 = pLVar33; pLVar30 != pLVar6; pLVar30 = pLVar30 + 1) {
        fVar37 = pLVar30->zScale;
        pLVar27->zOffset = pLVar30->zOffset;
        pLVar27->zScale = fVar37;
        lVar29 = 2;
        do {
          (pLVar27->color1).m_data[lVar29 + -2] = (pLVar30->color1).m_data[lVar29 + -2];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 6);
        lVar29 = 6;
        do {
          (pLVar27->color1).m_data[lVar29 + -2] = (pLVar30->color1).m_data[lVar29 + -2];
          lVar29 = lVar29 + 1;
        } while (lVar29 != 10);
        pLVar27 = pLVar27 + 1;
      }
      if (pLVar33 != (pointer)0x0) {
        operator_delete(pLVar33,(long)(this->m_layers).
                                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)pLVar33);
      }
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = pLVar21;
      pLVar33 = (pointer)((long)__s + uVar34 * 0x28);
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar33;
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pLVar21 + uVar26;
    }
    else {
      memset(pLVar33,0,uVar34 * 0x28);
      (this->m_layers).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish = pLVar33 + uVar34;
      pLVar33 = pLVar33 + uVar34;
    }
    uVar24 = (ulong)(uint)this->m_numLayers;
    if (0 < this->m_numLayers) {
      lVar29 = 0;
      lVar36 = 0;
      do {
        fVar37 = (float)(int)lVar36 / (float)(int)uVar24;
        pLVar33 = (this->m_layers).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(float *)((long)(pLVar33->color1).m_data + lVar29 + -8) = fVar37 + fVar37 + -1.0;
        *(float *)((long)(pLVar33->color1).m_data + lVar29 + -4) = 2.0 / (float)(int)uVar24;
        uVar46 = 0;
        if (lVar36 == 0) {
          uVar52 = 0x3f800000;
        }
        else {
          uVar52 = 0;
          uVar46 = 0x3f800000;
        }
        *(undefined4 *)((long)(pLVar33->color1).m_data + lVar29) = 0;
        *(undefined4 *)((long)(pLVar33->color1).m_data + lVar29 + 4) = uVar52;
        *(undefined4 *)((long)(pLVar33->color1).m_data + lVar29 + 8) = uVar46;
        *(undefined4 *)((long)(pLVar33->color1).m_data + lVar29 + 0xc) = 0x3f800000;
        pLVar33 = (this->m_layers).
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        *(undefined4 *)((long)(pLVar33->color2).m_data + lVar29) = 0x3f800000;
        *(undefined4 *)((long)(pLVar33->color2).m_data + lVar29 + 4) = uVar52;
        *(undefined4 *)((long)(pLVar33->color2).m_data + lVar29 + 8) = uVar46;
        *(undefined4 *)((long)(pLVar33->color2).m_data + lVar29 + 0xc) = 0x3f800000;
        lVar36 = lVar36 + 1;
        uVar24 = (ulong)this->m_numLayers;
        lVar29 = lVar29 + 0x28;
      } while (lVar36 < (long)uVar24);
      pLVar33 = (this->m_layers).
                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    pLVar6 = (this->m_layers).
             super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::DepthDrawCase::LayerInfo>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar19 = (int)((ulong)((long)pLVar33 - (long)pLVar6) >> 3) * -0x33333333 - 1;
    if (0 < (int)uVar19) {
      uVar24 = (ulong)uVar19 + 1;
      pLVar33 = pLVar6 + uVar19;
      do {
        dVar18 = deRandom_getUint32((deRandom *)local_368);
        uVar26 = (ulong)dVar18 % (uVar24 & 0xffffffff);
        uVar19 = (int)uVar26 * 5;
        fVar14 = pLVar33->zOffset;
        fVar15 = pLVar33->zScale;
        local_2c8 = *(undefined1 (*) [8])(pLVar33->color1).m_data;
        _Stack_2c0._M_current = *(int **)((pLVar33->color1).m_data + 2);
        uVar9 = *(undefined8 *)(pLVar33->color2).m_data;
        uVar10 = *(undefined8 *)((pLVar33->color2).m_data + 2);
        local_108._0_16_ = *(undefined1 (*) [16])(pLVar33->color2).m_data;
        *(undefined8 *)((pLVar33->color2).m_data + 2) =
             *(undefined8 *)(pLVar6[uVar26].color2.m_data + 2);
        pLVar30 = pLVar6 + uVar26;
        fVar37 = pLVar30->zOffset;
        fVar13 = pLVar30->zScale;
        uVar11 = *(undefined8 *)(pLVar30->color1).m_data;
        pfVar2 = pLVar6[uVar26].color1.m_data + 2;
        uVar12 = *(undefined8 *)(pfVar2 + 2);
        *(undefined8 *)((pLVar33->color1).m_data + 2) = *(undefined8 *)pfVar2;
        *(undefined8 *)(pLVar33->color2).m_data = uVar12;
        pLVar33->zOffset = fVar37;
        pLVar33->zScale = fVar13;
        *(undefined8 *)(pLVar33->color1).m_data = uVar11;
        pLVar6[uVar26].zOffset = fVar14;
        pLVar6[uVar26].zScale = fVar15;
        *(undefined1 (*) [8])pLVar6[uVar26].color1.m_data = local_2c8;
        *(int **)(pLVar6[uVar26].color1.m_data + 2) = _Stack_2c0._M_current;
        *(undefined8 *)pLVar6[uVar26].color2.m_data = uVar9;
        *(undefined8 *)(pLVar6[uVar26].color2.m_data + 2) = uVar10;
        uVar24 = uVar24 - 1;
        pLVar33 = pLVar33 + -1;
      } while (1 < uVar24);
    }
    return uVar19;
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  local_2c8 = (undefined1  [8])local_2b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2c8,"failed to build program","");
  tcu::TestError::TestError(this_04,(string *)local_2c8);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void DepthDrawCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");
	if (m_state == STATE_PER_PRIMITIVE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");
	if (m_context.getRenderTarget().getDepthBits() == 0)
		throw tcu::NotSupportedError("Test requires depth buffer");
	if (m_context.getRenderTarget().getWidth() < RENDER_AREA_SIZE || m_context.getRenderTarget().getHeight() < RENDER_AREA_SIZE)
		throw tcu::NotSupportedError("Test requires " + de::toString<int>(RENDER_AREA_SIZE) + "x" + de::toString<int>(RENDER_AREA_SIZE) + " viewport");

	// log
	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering multiple triangle grids with with different z coordinates.\n"
		<< "Topmost grid is green-yellow, other grids are blue-red.\n"
		<< "Expecting only the green-yellow grid to be visible.\n"
		<< "Setting primitive bounding box "
			<< ((m_bboxSize == BBOX_EQUAL) ? ("to exactly cover") : ("to cover"))
			<< ((m_state == STATE_GLOBAL) ? (" each grid") : (" each triangle"))
			<< ((m_bboxSize == BBOX_EQUAL) ? (".") : (" and include some padding."))
			<< "\n"
		<< "Set bounding box using "
			<< ((m_state == STATE_GLOBAL) ? ("PRIMITIVE_BOUNDING_BOX_EXT state") : ("gl_BoundingBoxEXT output"))
			<< "\n"
		<< ((m_depthType == DEPTH_USER_DEFINED) ? ("Fragment depth is set in the fragment shader") : (""))
		<< tcu::TestLog::EndMessage;

	// resources

	{
		glu::ProgramSources sources;
		sources << glu::VertexSource(specializeShader(m_context, genVertexSource().c_str()));
		sources << glu::FragmentSource(specializeShader(m_context, genFragmentSource().c_str()));

		if (m_state == STATE_PER_PRIMITIVE)
			sources << glu::TessellationControlSource(specializeShader(m_context, genTessellationControlSource().c_str()))
					<< glu::TessellationEvaluationSource(specializeShader(m_context, genTessellationEvaluationSource().c_str()));

		m_program = de::MovePtr<glu::ShaderProgram>(new glu::ShaderProgram(m_context.getRenderContext(), sources));
		GLU_EXPECT_NO_ERROR(gl.getError(), "build program");

		{
			const tcu::ScopedLogSection section(m_testCtx.getLog(), "ShaderProgram", "Shader program");
			m_testCtx.getLog() << *m_program;
		}

		if (!m_program->isOk())
			throw tcu::TestError("failed to build program");
	}

	{
		std::vector<tcu::Vec4> data;

		generateAttributeData(data);

		m_vbo = de::MovePtr<glu::Buffer>(new glu::Buffer(m_context.getRenderContext()));
		gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
		gl.bufferData(GL_ARRAY_BUFFER, (int)(sizeof(tcu::Vec4) * data.size()), &data[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "buf upload");
	}

	// gen layers
	{
		de::Random rnd(0x12345);

		m_layers.resize(m_numLayers);
		for (int layerNdx = 0; layerNdx < m_numLayers; ++layerNdx)
		{
			m_layers[layerNdx].zOffset	= ((float)layerNdx / (float)m_numLayers) * 2.0f - 1.0f;
			m_layers[layerNdx].zScale	= (2.0f / (float)m_numLayers);
			m_layers[layerNdx].color1	= (layerNdx == 0) ? (tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f));
			m_layers[layerNdx].color2	= (layerNdx == 0) ? (tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f)) : (tcu::Vec4(1.0f, 0.0f, 1.0f, 1.0f));
		}
		rnd.shuffle(m_layers.begin(), m_layers.end());
	}
}